

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_ctl_acpkm_omac(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  int in_ESI;
  undefined8 in_RDI;
  ossl_gost_cipher_ctx *out_cctx;
  ossl_gost_cipher_ctx *in_cctx;
  EVP_CIPHER_CTX *out;
  stack_st_X509_ATTRIBUTE *x;
  ossl_gost_cipher_ctx *c;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int encryption;
  stack_st_X509_ATTRIBUTE *in_stack_ffffffffffffffc8;
  int local_4;
  
  encryption = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if (in_ESI == 8) {
    lVar1 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RCX);
    if (*(long *)(lVar1 + 0x1080) == *(long *)(lVar2 + 0x1080)) {
      uVar3 = EVP_MD_CTX_new();
      *(undefined8 *)(lVar2 + 0x1080) = uVar3;
      if (*(long *)(lVar2 + 0x1080) == 0) {
        ERR_GOST_error(in_ESI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
        return -1;
      }
    }
    local_4 = EVP_MD_CTX_copy(*(EVP_MD_CTX **)(lVar2 + 0x1080),*(EVP_MD_CTX **)(lVar1 + 0x1080));
  }
  else if (in_ESI == 0x28) {
    EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    local_4 = gost2015_process_unprotected_attributes
                        (in_stack_ffffffffffffffc8,encryption,in_stack_ffffffffffffffb8,
                         (uchar *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
  }
  else {
    local_4 = magma_cipher_ctl((EVP_CIPHER_CTX *)x,out._4_4_,(int)out,in_cctx);
  }
  return local_4;
}

Assistant:

static int magma_cipher_ctl_acpkm_omac(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
	switch (type)
	{
		case EVP_CTRL_PROCESS_UNPROTECTED:
		{
			struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
			STACK_OF(X509_ATTRIBUTE) *x = ptr;
      return gost2015_process_unprotected_attributes(x, arg, MAGMA_MAC_MAX_SIZE, c->tag);
		}
    case EVP_CTRL_COPY: {
			EVP_CIPHER_CTX *out = ptr;
      struct ossl_gost_cipher_ctx *in_cctx  = EVP_CIPHER_CTX_get_cipher_data(ctx);
      struct ossl_gost_cipher_ctx *out_cctx = EVP_CIPHER_CTX_get_cipher_data(out);

			if (in_cctx->omac_ctx == out_cctx->omac_ctx) {
				out_cctx->omac_ctx = EVP_MD_CTX_new();
				if (out_cctx->omac_ctx == NULL) {
					GOSTerr(GOST_F_MAGMA_CIPHER_CTL_ACPKM_OMAC, ERR_R_MALLOC_FAILURE);
					return -1;
				}
			}
			return EVP_MD_CTX_copy(out_cctx->omac_ctx, in_cctx->omac_ctx);
		}
		default:
			return magma_cipher_ctl(ctx, type, arg, ptr);
			break;
	}
}